

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Edits::Iterator::destinationIndexFromSourceIndex
          (Iterator *this,int32_t i,UErrorCode *errorCode)

{
  int32_t iVar1;
  int32_t where;
  UErrorCode *errorCode_local;
  int32_t i_local;
  Iterator *this_local;
  
  iVar1 = findIndex(this,i,'\x01',errorCode);
  if (iVar1 < 0) {
    this_local._4_4_ = 0;
  }
  else if ((iVar1 < 1) && (i != this->srcIndex)) {
    if (this->changed == '\0') {
      this_local._4_4_ = this->destIndex + (i - this->srcIndex);
    }
    else {
      this_local._4_4_ = this->destIndex + this->newLength_;
    }
  }
  else {
    this_local._4_4_ = this->destIndex;
  }
  return this_local._4_4_;
}

Assistant:

int32_t Edits::Iterator::destinationIndexFromSourceIndex(int32_t i, UErrorCode &errorCode) {
    int32_t where = findIndex(i, TRUE, errorCode);
    if (where < 0) {
        // Error or before the string.
        return 0;
    }
    if (where > 0 || i == srcIndex) {
        // At or after string length, or at start of the found span.
        return destIndex;
    }
    if (changed) {
        // In a change span, map to its end.
        return destIndex + newLength_;
    } else {
        // In an unchanged span, offset 1:1 within it.
        return destIndex + (i - srcIndex);
    }
}